

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O2

void run_ecmult_multi_bench(bench_data *data,size_t count,int includes_g,int num_iters)

{
  uint64_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  secp256k1_scalar total;
  char str [32];
  
  uVar4 = (ulong)(long)includes_g / count + 1;
  data->count = count;
  data->includes_g = 1;
  iVar7 = (int)count;
  data->offset1 = (ulong)(iVar7 * 0x7f6f + 0x2481U & 0x7fff);
  data->offset2 = (ulong)(iVar7 * 0x537b + 0xf49U & 0x7fff);
  for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
    sVar2 = data->offset1;
    data->offset1 = sVar2 + 1;
    uVar5 = (ulong)(((uint)sVar2 & 0x7fff) << 5);
    puVar1 = (uint64_t *)((long)data->scalars->d + uVar5);
    total.d[0] = *puVar1;
    total.d[1] = puVar1[1];
    puVar1 = (uint64_t *)((long)data->scalars->d + uVar5 + 0x10);
    total.d[2] = *puVar1;
    total.d[3] = puVar1[1];
    for (uVar5 = 1; uVar5 < count; uVar5 = uVar5 + 1) {
      sVar2 = data->offset1;
      sVar3 = data->offset2;
      data->offset2 = sVar3 + 1;
      data->offset1 = sVar2 + 1;
      secp256k1_scalar_mul
                ((secp256k1_scalar *)str,
                 (secp256k1_scalar *)((long)data->seckeys->d + (ulong)(((uint)sVar3 & 0x7fff) << 5))
                 ,(secp256k1_scalar *)
                  ((long)data->scalars->d + (ulong)(((uint)sVar2 & 0x7fff) << 5)));
      secp256k1_scalar_add(&total,&total,(secp256k1_scalar *)str);
    }
    secp256k1_scalar_negate(&total,&total);
    secp256k1_ecmult(data->expected_output + uVar6,(secp256k1_gej *)0x0,&secp256k1_scalar_zero,
                     &total);
  }
  sprintf(str,"ecmult_multi_%ip_g",(ulong)(iVar7 - 1));
  run_benchmark(str,bench_ecmult_multi,bench_ecmult_multi_setup,bench_ecmult_multi_teardown,data,
                (int)uVar4 * iVar7,(int)uVar4);
  return;
}

Assistant:

static void run_ecmult_multi_bench(bench_data* data, size_t count, int includes_g, int num_iters) {
    char str[32];
    size_t iters = 1 + num_iters / count;
    size_t iter;

    data->count = count;
    data->includes_g = includes_g;

    /* Compute (the negation of) the expected results directly. */
    hash_into_offset(data, data->count);
    for (iter = 0; iter < iters; ++iter) {
        secp256k1_scalar tmp;
        secp256k1_scalar total = data->scalars[(data->offset1++) % POINTS];
        size_t i = 0;
        for (i = 0; i + 1 < count; ++i) {
            secp256k1_scalar_mul(&tmp, &data->seckeys[(data->offset2++) % POINTS], &data->scalars[(data->offset1++) % POINTS]);
            secp256k1_scalar_add(&total, &total, &tmp);
        }
        secp256k1_scalar_negate(&total, &total);
        secp256k1_ecmult(&data->expected_output[iter], NULL, &secp256k1_scalar_zero, &total);
    }

    /* Run the benchmark. */
    if (includes_g) {
        sprintf(str, "ecmult_multi_%ip_g", (int)count - 1);
    } else {
        sprintf(str, "ecmult_multi_%ip", (int)count);
    }
    run_benchmark(str, bench_ecmult_multi, bench_ecmult_multi_setup, bench_ecmult_multi_teardown, data, 10, count * iters);
}